

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_file_utils.cpp
# Opt level: O1

bool crnlib::file_utils::full_path(dynamic_string *path)

{
  int iVar1;
  bool bVar2;
  char *pcVar3;
  dynamic_string fn;
  dynamic_string pn;
  char buf [4096];
  dynamic_string local_1038;
  dynamic_string local_1028;
  char local_1018 [4096];
  
  local_1028.m_buf_size = 0;
  local_1028.m_len = 0;
  local_1028.m_pStr = (char *)0x0;
  local_1038.m_buf_size = 0;
  local_1038.m_len = 0;
  local_1038.m_pStr = (char *)0x0;
  pcVar3 = path->m_pStr;
  if (pcVar3 == (char *)0x0) {
    pcVar3 = "";
  }
  split_path(pcVar3,&local_1028,&local_1038);
  iVar1 = dynamic_string::compare(&local_1038,".",false);
  if (iVar1 == 0) {
LAB_00118fc1:
    pcVar3 = "";
    if (path->m_pStr != (char *)0x0) {
      pcVar3 = path->m_pStr;
    }
    pcVar3 = realpath(pcVar3,local_1018);
    if (pcVar3 != (char *)0x0) {
      bVar2 = true;
      dynamic_string::set(path,local_1018,0xffffffff);
      goto LAB_00118ff7;
    }
  }
  else {
    iVar1 = dynamic_string::compare(&local_1038,"..",false);
    if (iVar1 == 0) goto LAB_00118fc1;
    if (local_1028.m_len == 0) {
      dynamic_string::set(&local_1028,"./",0xffffffff);
    }
    pcVar3 = local_1028.m_pStr;
    if (local_1028.m_pStr == (char *)0x0) {
      pcVar3 = "";
    }
    pcVar3 = realpath(pcVar3,local_1018);
    if (pcVar3 != (char *)0x0) {
      pcVar3 = "";
      if (local_1038.m_pStr != (char *)0x0) {
        pcVar3 = local_1038.m_pStr;
      }
      bVar2 = true;
      combine_path(path,local_1018,pcVar3);
      goto LAB_00118ff7;
    }
  }
  bVar2 = false;
LAB_00118ff7:
  if ((local_1038.m_pStr != (char *)0x0) &&
     ((*(uint *)(local_1038.m_pStr + -8) ^ *(uint *)(local_1038.m_pStr + -4)) == 0xffffffff)) {
    crnlib_free(local_1038.m_pStr + -0x10);
  }
  if ((local_1028.m_pStr != (char *)0x0) &&
     ((*(uint *)(local_1028.m_pStr + -8) ^ *(uint *)(local_1028.m_pStr + -4)) == 0xffffffff)) {
    crnlib_free(local_1028.m_pStr + -0x10);
  }
  return bVar2;
}

Assistant:

bool file_utils::full_path(dynamic_string& path) {
#ifdef WIN32
  char buf[1024];
  char* p = _fullpath(buf, path.get_ptr(), sizeof(buf));
  if (!p)
    return false;
#else
  char buf[PATH_MAX];
  char* p;
  dynamic_string pn, fn;
  split_path(path.get_ptr(), pn, fn);
  if ((fn == ".") || (fn == "..")) {
    p = realpath(path.get_ptr(), buf);
    if (!p)
      return false;
    path.set(buf);
  } else {
    if (pn.is_empty())
      pn = "./";
    p = realpath(pn.get_ptr(), buf);
    if (!p)
      return false;
    combine_path(path, buf, fn.get_ptr());
  }
#endif

  return true;
}